

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  uint uVar1;
  int iVar2;
  Instruction i;
  
  switch(var->k) {
  case VLOCAL:
    if (((ex->k == VNONRELOC) && (uVar1 = (ex->u).s.info, (uVar1 >> 8 & 1) == 0)) &&
       ((int)(uint)fs->nactvar <= (int)uVar1)) {
      fs->freereg = fs->freereg + -1;
    }
    exp2reg(fs,ex,(var->u).s.info);
    return;
  case VUPVAL:
    iVar2 = luaK_exp2anyreg(fs,ex);
    i = (var->u).s.info << 0x17 | iVar2 << 6 | 8;
    break;
  case VGLOBAL:
    iVar2 = luaK_exp2anyreg(fs,ex);
    i = (var->u).s.info << 0xe | iVar2 << 6 | 7;
    break;
  case VINDEXED:
    iVar2 = luaK_exp2RK(fs,ex);
    i = iVar2 << 0xe | (var->u).s.info << 6 | (var->u).s.aux << 0x17 | 9;
    break;
  default:
    goto switchD_0010f5cf_default;
  }
  luaK_code(fs,i,fs->ls->lastline);
switchD_0010f5cf_default:
  if (((ex->k == VNONRELOC) && (uVar1 = (ex->u).s.info, (uVar1 >> 8 & 1) == 0)) &&
     ((int)(uint)fs->nactvar <= (int)uVar1)) {
    fs->freereg = fs->freereg + -1;
  }
  return;
}

Assistant:

static void luaK_storevar(FuncState*fs,expdesc*var,expdesc*ex){
switch(var->k){
case VLOCAL:{
freeexp(fs,ex);
exp2reg(fs,ex,var->u.s.info);
return;
}
case VUPVAL:{
int e=luaK_exp2anyreg(fs,ex);
luaK_codeABC(fs,OP_SETUPVAL,e,var->u.s.info,0);
break;
}
case VGLOBAL:{
int e=luaK_exp2anyreg(fs,ex);
luaK_codeABx(fs,OP_SETGLOBAL,e,var->u.s.info);
break;
}
case VINDEXED:{
int e=luaK_exp2RK(fs,ex);
luaK_codeABC(fs,OP_SETTABLE,var->u.s.info,var->u.s.aux,e);
break;
}
default:{
break;
}
}
freeexp(fs,ex);
}